

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1273::run(TestCase1273 *this)

{
  bool bVar1;
  bool local_181;
  DebugExpression<bool_&> DStack_180;
  bool _kj_shouldLog_2;
  DebugExpression<bool_&> _kjCondition_2;
  SourceLocation local_170;
  __pid_t local_154;
  int local_150;
  bool local_14a;
  undefined1 auStack_148 [6];
  bool _kj_shouldLog_1;
  __pid_t local_12c;
  int local_128;
  DebugExpression<int> local_124;
  undefined1 local_120 [8];
  DebugComparison<int,_int> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  Promise<int> local_f0;
  undefined1 local_e8 [32];
  Type local_c8;
  Promise<int> promise;
  undefined1 local_b0 [8];
  WaitScope waitScope;
  EventLoop loop;
  bool destroyed;
  TestCase1273 *this_local;
  
  loop.currentlyFiring._7_1_ = 0;
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_b0,(EventLoop *)&waitScope.runningStacksPool);
  local_e8._16_8_ = (long)&loop.currentlyFiring + 7;
  evalLater<kj::(anonymous_namespace)::TestCase1273::run()::__0>
            ((kj *)(local_e8 + 0x18),(Type *)(local_e8 + 0x10));
  heap<kj::(anonymous_namespace)::DestructorDetector,bool&>
            ((kj *)local_e8,(bool *)((long)&loop.currentlyFiring + 7));
  Promise<int>::attach<kj::Own<kj::(anonymous_namespace)::DestructorDetector,decltype(nullptr)>>
            ((Promise<int> *)&local_c8,
             (Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t> *)(local_e8 + 0x18)
            );
  Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t> *)local_e8);
  Promise<int>::~Promise((Promise<int> *)(local_e8 + 0x18));
  Promise<int>::then<kj::(anonymous_namespace)::TestCase1273::run()::__1>(&local_f0,&local_c8);
  Promise<int>::operator=((Promise<int> *)&local_c8,&local_f0);
  Promise<int>::~Promise(&local_f0);
  _kjCondition_1._30_1_ = ~loop.currentlyFiring._7_1_ & 1;
  _kjCondition_1._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_1.field_0x1e);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_1.field_0x1f);
  if (!bVar1) {
    _kjCondition_1._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._29_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[30],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x509,ERROR,"\"failed: expected \" \"!(destroyed)\", _kjCondition",
                 (char (*) [30])"failed: expected !(destroyed)",
                 (DebugExpression<bool> *)&_kjCondition_1.field_0x1f);
      _kjCondition_1._29_1_ = 0;
    }
  }
  local_128 = 0x1bc;
  local_124 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_128);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_148,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x50a,0x29);
  local_12c = Promise<int>::wait((Promise<int> *)&local_c8,local_b0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_120,&local_124,&local_12c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
  if (!bVar1) {
    local_14a = kj::_::Debug::shouldLog(ERROR);
    while (local_14a != false) {
      local_150 = 0x1bc;
      SourceLocation::SourceLocation
                (&local_170,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x50a,0x29);
      local_154 = Promise<int>::wait((Promise<int> *)&local_c8,local_b0);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x50a,ERROR,
                 "\"failed: expected \" \"(444) == (promise.wait(waitScope))\", _kjCondition, 444, promise.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (444) == (promise.wait(waitScope))",
                 (DebugComparison<int,_int> *)local_120,&local_150,&local_154);
      local_14a = false;
    }
  }
  DStack_180 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&loop.currentlyFiring + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffffe80)
  ;
  if (!bVar1) {
    local_181 = kj::_::Debug::shouldLog(ERROR);
    while (local_181 != false) {
      kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x50b,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
                 (char (*) [27])"failed: expected destroyed",&stack0xfffffffffffffe80);
      local_181 = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)&local_c8);
  WaitScope::~WaitScope((WaitScope *)local_b0);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, Attach) {
  bool destroyed = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() {
    EXPECT_FALSE(destroyed);
    return 123;
  }).attach(kj::heap<DestructorDetector>(destroyed));

  promise = promise.then([&](int i) {
    EXPECT_TRUE(destroyed);
    return i + 321;
  });

  EXPECT_FALSE(destroyed);
  EXPECT_EQ(444, promise.wait(waitScope));
  EXPECT_TRUE(destroyed);
}